

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O2

ares_status_t ares_dns_parse(uchar *buf,size_t buf_len,uint flags,ares_dns_record_t **dnsrec)

{
  ares_dns_record_t *paVar1;
  unsigned_short uVar2;
  ares_status_t aVar3;
  ares_bool_t aVar4;
  ares_buf_t *buf_00;
  size_t sVar5;
  ushort uVar6;
  unsigned_short u16_1;
  unsigned_short local_48;
  unsigned_short nscount;
  unsigned_short ancount;
  unsigned_short qdcount;
  unsigned_short u16;
  ares_dns_rec_type_t local_34;
  
  if (dnsrec == (ares_dns_record_t **)0x0 || (buf_len == 0 || buf == (uchar *)0x0)) {
    return ARES_EFORMERR;
  }
  buf_00 = ares_buf_create_const(buf,buf_len);
  if (buf_00 == (ares_buf_t *)0x0) {
    return ARES_ENOMEM;
  }
  sVar5 = ares_buf_len(buf_00);
  if (0xffff < sVar5) {
    aVar3 = ARES_EFORMERR;
    goto LAB_0011f6c9;
  }
  *dnsrec = (ares_dns_record_t *)0x0;
  aVar3 = ares_buf_fetch_be16(buf_00,&u16_1);
  if ((aVar3 == ARES_SUCCESS) && (aVar3 = ares_buf_fetch_be16(buf_00,&u16), aVar3 == ARES_SUCCESS))
  {
    uVar2 = u16;
    aVar3 = ares_buf_fetch_be16(buf_00,&qdcount);
    if ((aVar3 == ARES_SUCCESS) &&
       ((((aVar3 = ares_buf_fetch_be16(buf_00,&ancount), aVar3 == ARES_SUCCESS &&
          (aVar3 = ares_buf_fetch_be16(buf_00,&nscount), aVar3 == ARES_SUCCESS)) &&
         (aVar3 = ares_buf_fetch_be16(buf_00,&local_48), aVar3 == ARES_SUCCESS)) &&
        (aVar3 = ares_dns_record_create
                           (dnsrec,u16_1,
                            uVar2 * 4 & 0x40 |
                            uVar2 & 0x20 | uVar2 >> 0xf | uVar2 >> 9 & 2 | uVar2 >> 7 & 4 |
                            uVar2 >> 5 & 8 | uVar2 >> 3 & 0x10,uVar2 >> 0xb & 0xf,ARES_RCODE_NOERROR
                           ), aVar3 == ARES_SUCCESS)))) {
      paVar1 = *dnsrec;
      paVar1->raw_rcode = uVar2 & 0xf;
      if (((((ulong)ancount == 0) ||
           (aVar3 = ares_dns_record_rr_prealloc(paVar1,ARES_SECTION_ANSWER,(ulong)ancount),
           aVar3 == ARES_SUCCESS)) &&
          (((ulong)nscount == 0 ||
           (aVar3 = ares_dns_record_rr_prealloc(*dnsrec,ARES_SECTION_AUTHORITY,(ulong)nscount),
           aVar3 == ARES_SUCCESS)))) &&
         (((ulong)local_48 == 0 ||
          (aVar3 = ares_dns_record_rr_prealloc(*dnsrec,ARES_SECTION_ADDITIONAL,(ulong)local_48),
          aVar3 == ARES_SUCCESS)))) {
        if (qdcount == 1) {
          uVar6 = 0xffff;
          do {
            uVar6 = uVar6 + 1;
            if (qdcount <= uVar6) {
              uVar6 = 0xffff;
              goto LAB_0011f7e1;
            }
            paVar1 = *dnsrec;
            _u16 = (char *)0x0;
            aVar3 = ares_dns_name_parse(buf_00,(char **)&u16,ARES_FALSE);
            if ((aVar3 == ARES_SUCCESS) &&
               (aVar3 = ares_buf_fetch_be16(buf_00,&u16_1), aVar3 == ARES_SUCCESS)) {
              local_34 = (ares_dns_rec_type_t)u16_1;
              aVar3 = ares_buf_fetch_be16(buf_00,&u16_1);
              if (aVar3 == ARES_SUCCESS) {
                aVar3 = ares_dns_record_query_add(paVar1,_u16,local_34,(uint)u16_1);
              }
            }
            ares_free(_u16);
          } while (aVar3 == ARES_SUCCESS);
        }
        else {
          aVar3 = ARES_EBADRESP;
        }
        goto LAB_0011f6bd;
      }
    }
  }
  ares_dns_record_destroy(*dnsrec);
  *dnsrec = (ares_dns_record_t *)0x0;
  qdcount = 0;
  ancount = 0;
  nscount = 0;
  local_48 = 0;
  goto LAB_0011f6bd;
  while (aVar3 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_ANSWER,*dnsrec), aVar3 == ARES_SUCCESS)
  {
LAB_0011f7e1:
    uVar6 = uVar6 + 1;
    if (ancount <= uVar6) {
      uVar6 = 0xffff;
      goto LAB_0011f811;
    }
  }
  goto LAB_0011f6bd;
  while (aVar3 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_AUTHORITY,*dnsrec),
        aVar3 == ARES_SUCCESS) {
LAB_0011f811:
    uVar6 = uVar6 + 1;
    if (nscount <= uVar6) {
      uVar6 = 0xffff;
      goto LAB_0011f841;
    }
  }
  goto LAB_0011f6bd;
  while (aVar3 = ares_dns_parse_rr(buf_00,flags,ARES_SECTION_ADDITIONAL,*dnsrec),
        aVar3 == ARES_SUCCESS) {
LAB_0011f841:
    uVar6 = uVar6 + 1;
    if (local_48 <= uVar6) {
      aVar4 = ares_dns_rcode_isvalid((uint)(*dnsrec)->raw_rcode);
      paVar1 = *dnsrec;
      if (aVar4 == ARES_FALSE) {
        paVar1->rcode = ARES_RCODE_SERVFAIL;
      }
      else {
        paVar1->rcode = (uint)paVar1->raw_rcode;
      }
      aVar3 = ARES_SUCCESS;
      goto LAB_0011f6c9;
    }
  }
LAB_0011f6bd:
  ares_dns_record_destroy(*dnsrec);
  *dnsrec = (ares_dns_record_t *)0x0;
LAB_0011f6c9:
  ares_buf_destroy(buf_00);
  return aVar3;
}

Assistant:

ares_status_t ares_dns_parse(const unsigned char *buf, size_t buf_len,
                             unsigned int flags, ares_dns_record_t **dnsrec)
{
  ares_buf_t   *parser = NULL;
  ares_status_t status;

  if (buf == NULL || buf_len == 0 || dnsrec == NULL) {
    return ARES_EFORMERR;
  }

  parser = ares_buf_create_const(buf, buf_len);
  if (parser == NULL) {
    return ARES_ENOMEM;
  }

  status = ares_dns_parse_buf(parser, flags, dnsrec);
  ares_buf_destroy(parser);

  return status;
}